

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# text_format.cc
# Opt level: O1

void __thiscall
google::protobuf::TextFormat::Printer::PrintShortRepeatedField
          (Printer *this,Message *message,Reflection *reflection,FieldDescriptor *field,
          TextGenerator *generator)

{
  int iVar1;
  char *text;
  int index;
  
  PrintFieldName(this,message,reflection,field,generator);
  iVar1 = (*reflection->_vptr_Reflection[6])(reflection,message,field);
  TextGenerator::Print(generator,": [",3);
  if (0 < iVar1) {
    index = 0;
    do {
      if (index != 0) {
        TextGenerator::Print(generator,", ",2);
      }
      PrintFieldValue(this,message,reflection,field,index,generator);
      index = index + 1;
    } while (iVar1 != index);
  }
  text = "]\n";
  if (this->single_line_mode_ != false) {
    text = "] ";
  }
  TextGenerator::Print(generator,text,2);
  return;
}

Assistant:

void TextFormat::Printer::PrintShortRepeatedField(
    const Message& message,
    const Reflection* reflection,
    const FieldDescriptor* field,
    TextGenerator& generator) const {
  // Print primitive repeated field in short form.
  PrintFieldName(message, reflection, field, generator);

  int size = reflection->FieldSize(message, field);
  generator.Print(": [");
  for (int i = 0; i < size; i++) {
    if (i > 0) generator.Print(", ");
    PrintFieldValue(message, reflection, field, i, generator);
  }
  if (single_line_mode_) {
    generator.Print("] ");
  } else {
    generator.Print("]\n");
  }
}